

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misctests.c
# Opt level: O2

void mstltest2(void)

{
  bool bVar1;
  double **seasonal;
  double *trend;
  double *remainder;
  double *pdVar2;
  long lVar3;
  long lVar4;
  double local_4d8;
  double x [144];
  int local_40 [2];
  int iterate;
  int s_window;
  int Nseas;
  int f [1];
  
  memcpy(&local_4d8,&DAT_00152fe0,0x480);
  iterate = 1;
  s_window = 0xc;
  local_40[0] = 2;
  local_40[1] = 0xd;
  seasonal = (double **)calloc(1,8);
  trend = (double *)calloc(0x90,8);
  remainder = (double *)calloc(0x90,8);
  bVar1 = true;
  lVar4 = 0;
  while (bVar1) {
    pdVar2 = (double *)calloc(0x90,8);
    seasonal[lVar4] = pdVar2;
    bVar1 = false;
    lVar4 = 1;
  }
  mstl(&local_4d8,0x90,&s_window,&iterate,local_40 + 1,(double *)0x0,local_40,seasonal,trend,
       remainder);
  for (lVar4 = 0; lVar4 < iterate; lVar4 = lVar4 + 1) {
    printf("\n Seasonal%d :\n",(ulong)(uint)s_window);
    for (lVar3 = 0; lVar3 != 0x90; lVar3 = lVar3 + 1) {
      printf("%g ",seasonal[lVar4][lVar3]);
    }
    puts("\n");
  }
  mdisplay(trend,1,0x90);
  mdisplay(remainder,1,0x90);
  free(seasonal);
  free(trend);
  free(remainder);
  return;
}

Assistant:

void mstltest2() {
	double x[144] = {112, 118, 132, 129, 121, 135, 148, 148, 136, 119, 104, 118,
        115, 126, 141, 135, 125, 149, 170, 170, 158, 133, 114, 140,
        145, 150, 178, 163, 172, 178, 199, 199, 184, 162, 146, 166,
        171, 180, 193, 181, 183, 218, 230, 242, 209, 191, 172, 194,
        196, 196, 236, 235, 229, 243, 264, 272, 237, 211, 180, 201,
        204, 188, 235, 227, 234, 264, 302, 293, 259, 229, 203, 229,
        242, 233, 267, 269, 270, 315, 364, 347, 312, 274, 237, 278,
        284, 277, 317, 313, 318, 374, 413, 405, 355, 306, 271, 306,
        315, 301, 356, 348, 355, 422, 465, 467, 404, 347, 305, 336,
        340, 318, 362, 348, 363, 435, 491, 505, 404, 359, 310, 337,
        360, 342, 406, 396, 420, 472, 548, 559, 463, 407, 362, 405,
        417, 391, 419, 461, 472, 535, 622, 606, 508, 461, 390, 432
	};

	int N = 144,i,j;
	int Nseas = 1;
	int f[1] = {12};
	int iterate = 2;
	double **seasonal,*trend,*remainder;
	int s_window = 13;
	double lambda;

	seasonal = (double**)calloc(Nseas,sizeof(double*));
	trend = (double*)calloc(N,sizeof(double));
	remainder = (double*)calloc(N,sizeof(double));

	for(i = 0; i < Nseas;++i) {
		seasonal[i] = (double*)calloc(N,sizeof(double));
	}

	mstl(x, N,f,&Nseas,&s_window,NULL,&iterate,seasonal,trend,remainder);

	for(i = 0; i < Nseas;++i) {
		printf("\n Seasonal%d :\n",f[i]);
		for(j = 0; j < N;++j) {
			printf("%g ",seasonal[i][j]);
		}
		printf("\n\n");
	}

	mdisplay(trend,1,N);
	mdisplay(remainder,1,N);
	free(seasonal);
	free(trend);
	free(remainder);
}